

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::LocalAssertionVarSymbol_const*>::
emplace_back<slang::ast::LocalAssertionVarSymbol_const*const&>
          (SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*> *this,
          LocalAssertionVarSymbol **args)

{
  iterator ppLVar1;
  undefined8 *in_RSI;
  SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*> *in_RDI;
  LocalAssertionVarSymbol **in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>::end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::LocalAssertionVarSymbol_const*const&>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    ppLVar1 = SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>::end(in_RDI);
    *ppLVar1 = (LocalAssertionVarSymbol *)*in_RSI;
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>::back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }